

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::MultiplyWithScaledMatrix(Model *this,Vector *rhs,double alpha,Vector *lhs,char trans)

{
  bool bVar1;
  double *pdVar2;
  char in_CL;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  Model *in_RDI;
  double in_XMM0_Qa;
  Int j_1;
  Int i_1;
  Int j;
  Int i;
  Vector *in_stack_ffffffffffffff88;
  double dVar3;
  Vector *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  SparseMatrix *in_stack_ffffffffffffffa0;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  
  if ((in_CL == 't') || (in_CL == 'T')) {
    bVar1 = dualized(in_RDI);
    if (bVar1) {
      for (local_28 = 0; local_28 < in_RDI->num_constr_; local_28 = local_28 + 1) {
        std::valarray<double>::operator[](in_RSI,(long)local_28);
        ScatterColumn(in_stack_ffffffffffffffa0,(Int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (double)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    else {
      for (local_2c = 0; local_2c < in_RDI->num_var_; local_2c = local_2c + 1) {
        dVar3 = in_XMM0_Qa;
        in_stack_ffffffffffffffa0 =
             (SparseMatrix *)
             DotColumn(in_stack_ffffffffffffffa0,(Int)((ulong)in_XMM0_Qa >> 0x20),
                       in_stack_ffffffffffffff90);
        pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_2c);
        *pdVar2 = dVar3 * (double)in_stack_ffffffffffffffa0 + *pdVar2;
      }
    }
  }
  else {
    bVar1 = dualized(in_RDI);
    if (bVar1) {
      for (local_30 = 0; local_30 < in_RDI->num_constr_; local_30 = local_30 + 1) {
        dVar3 = in_XMM0_Qa;
        in_stack_ffffffffffffff90 =
             (Vector *)
             DotColumn(in_stack_ffffffffffffffa0,(Int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                       in_stack_ffffffffffffff90);
        pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_30);
        *pdVar2 = dVar3 * (double)in_stack_ffffffffffffff90 + *pdVar2;
      }
    }
    else {
      for (local_34 = 0; local_34 < in_RDI->num_var_; local_34 = local_34 + 1) {
        std::valarray<double>::operator[](in_RSI,(long)local_34);
        ScatterColumn(in_stack_ffffffffffffffa0,(Int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (double)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

void Model::MultiplyWithScaledMatrix(const Vector& rhs, double alpha,
                                     Vector& lhs, char trans) const {
    if (trans == 't' || trans == 'T') {
        assert((Int)rhs.size() == num_constr_);
        assert((Int)lhs.size() == num_var_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                ScatterColumn(AI_, i, alpha*rhs[i], lhs);
        else
            for (Int j = 0; j < num_var_; j++)
                lhs[j] += alpha * DotColumn(AI_, j, rhs);
    }
    else {
        assert((Int)rhs.size() == num_var_);
        assert((Int)lhs.size() == num_constr_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                lhs[i] += alpha * DotColumn(AI_, i, rhs);
        else
            for (Int j = 0; j < num_var_; j++)
                ScatterColumn(AI_, j, alpha*rhs[j], lhs);
    }
}